

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

Float __thiscall pbrt::Vertex::PDF(Vertex *this,Integrator *integrator,Vertex *prev,Vertex *next)

{
  anon_union_248_3_83785cfc_for_Vertex_2 *this_00;
  VertexType VVar1;
  float fVar2;
  undefined1 auVar3 [16];
  Vector3f wiRender;
  Vector3f wi;
  Float FVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  Point3f PVar14;
  Vector3<float> VVar15;
  Float pdf;
  float local_cc;
  Tuple3<pbrt::Vector3,_float> local_c8;
  Tuple3<pbrt::Vector3,_float> local_b8;
  undefined1 local_a8 [16];
  Float unused;
  RayDifferential local_88;
  
  auVar13 = in_ZMM0._8_56_;
  if (this->type == Light) {
    FVar4 = PDFLight(this,integrator,next);
    return FVar4;
  }
  PVar14 = Interaction::p(&(next->field_2).ei.super_Interaction);
  local_cc = PVar14.super_Tuple3<pbrt::Point3,_float>.z;
  auVar7._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar7._8_56_ = auVar13;
  this_00 = &this->field_2;
  local_a8 = auVar7._0_16_;
  PVar14 = Interaction::p(&(this_00->ei).super_Interaction);
  auVar8._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar13;
  auVar3 = vsubps_avx(local_a8,auVar8._0_16_);
  local_c8.z = local_cc - PVar14.super_Tuple3<pbrt::Point3,_float>.z;
  local_c8._0_8_ = vmovlps_avx(auVar3);
  auVar5._0_4_ = auVar3._0_4_ * auVar3._0_4_;
  auVar5._4_4_ = auVar3._4_4_ * auVar3._4_4_;
  auVar5._8_4_ = auVar3._8_4_ * auVar3._8_4_;
  auVar5._12_4_ = auVar3._12_4_ * auVar3._12_4_;
  auVar3 = vhaddps_avx(auVar5,auVar5);
  fVar2 = local_c8.z * local_c8.z + auVar3._0_4_;
  auVar13 = ZEXT856(0);
  if ((fVar2 == 0.0) && (!NAN(fVar2))) {
    return 0.0;
  }
  VVar15 = Normalize<float>((Vector3<float> *)&local_c8);
  local_c8.z = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar13;
  local_b8.x = 0.0;
  local_b8.y = 0.0;
  local_b8.z = 0.0;
  local_c8._0_8_ = vmovlps_avx(auVar9._0_16_);
  if (prev == (Vertex *)0x0) {
    if (this->type != Camera) {
      LogFatal<char_const(&)[27]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
                 ,0x6db,"Check failed: %s",(char (*) [27])"type == VertexType::Camera");
    }
  }
  else {
    PVar14 = Interaction::p(&(prev->field_2).ei.super_Interaction);
    local_cc = PVar14.super_Tuple3<pbrt::Point3,_float>.z;
    auVar10._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar10._8_56_ = auVar13;
    local_a8 = auVar10._0_16_;
    PVar14 = Interaction::p(&(this_00->ei).super_Interaction);
    auVar11._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar11._8_56_ = auVar13;
    auVar3 = vsubps_avx(local_a8,auVar11._0_16_);
    local_b8.z = local_cc - PVar14.super_Tuple3<pbrt::Point3,_float>.z;
    local_b8._0_8_ = vmovlps_avx(auVar3);
    auVar6._0_4_ = auVar3._0_4_ * auVar3._0_4_;
    auVar6._4_4_ = auVar3._4_4_ * auVar3._4_4_;
    auVar6._8_4_ = auVar3._8_4_ * auVar3._8_4_;
    auVar6._12_4_ = auVar3._12_4_ * auVar3._12_4_;
    auVar3 = vhaddps_avx(auVar6,auVar6);
    fVar2 = local_b8.z * local_b8.z + auVar3._0_4_;
    auVar13 = ZEXT856(0);
    if ((fVar2 == 0.0) && (!NAN(fVar2))) {
      return 0.0;
    }
    VVar15 = Normalize<float>((Vector3<float> *)&local_b8);
    local_b8.z = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar12._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar12._8_56_ = auVar13;
    local_b8._0_8_ = vmovlps_avx(auVar12._0_16_);
    VVar1 = this->type;
    pdf = 0.0;
    if (VVar1 == Medium) {
      wi.super_Tuple3<pbrt::Vector3,_float>.z = local_c8.z;
      wi.super_Tuple3<pbrt::Vector3,_float>.x = local_c8.x;
      wi.super_Tuple3<pbrt::Vector3,_float>.y = local_c8.y;
      pdf = PhaseFunctionHandle::p
                      (&(this->field_2).mi.phase,(Vector3f)VVar15.super_Tuple3<pbrt::Vector3,_float>
                       ,wi);
      goto LAB_003e169d;
    }
    if (VVar1 == Surface) {
      wiRender.super_Tuple3<pbrt::Vector3,_float>.z = local_c8.z;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.x = local_c8.x;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.y = local_c8.y;
      pdf = BSDF::PDF(&this->bsdf,(Vector3f)VVar15.super_Tuple3<pbrt::Vector3,_float>,wiRender,
                      Radiance,All);
      goto LAB_003e169d;
    }
    if (VVar1 != Camera) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
               ,0x6e6,"Vertex::PDF(): Unimplemented");
    }
  }
  pdf = 0.0;
  Interaction::SpawnRay(&local_88,&(this_00->ei).super_Interaction,(Vector3f *)&local_c8);
  CameraHandle::PDF_We((CameraHandle *)&(this->field_2).mi.phase,&local_88.super_Ray,&unused,&pdf);
LAB_003e169d:
  FVar4 = ConvertDensity(this,pdf,next);
  return FVar4;
}

Assistant:

Float PDF(const Integrator &integrator, const Vertex *prev,
              const Vertex &next) const {
        if (type == VertexType::Light)
            return PDFLight(integrator, next);
        // Compute directions to preceding and next vertex
        Vector3f wn = next.p() - p();
        if (LengthSquared(wn) == 0)
            return 0;
        wn = Normalize(wn);
        Vector3f wp;
        if (prev) {
            wp = prev->p() - p();
            if (LengthSquared(wp) == 0)
                return 0;
            wp = Normalize(wp);
        } else
            CHECK(type == VertexType::Camera);

        // Compute directional density depending on the vertex type
        Float pdf = 0, unused;
        if (type == VertexType::Camera)
            ei.camera.PDF_We(ei.SpawnRay(wn), &unused, &pdf);
        else if (type == VertexType::Surface)
            pdf = bsdf.PDF(wp, wn);
        else if (type == VertexType::Medium)
            pdf = mi.phase.p(wp, wn);
        else
            LOG_FATAL("Vertex::PDF(): Unimplemented");

        // Return probability per unit area at vertex _next_
        return ConvertDensity(pdf, next);
    }